

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O0

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_pread
          (basic_random_coro_file<(coro_io::execution_type)2> *this,size_t offset,char *data,
          size_t size)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<std::pair<std::error_code,_unsigned_long>,_false> in_RDI;
  undefined8 in_R8;
  char *in_stack_000000d8;
  size_t in_stack_000000e0;
  bool in_stack_000000ef;
  _func_long_int_void_ptr_unsigned_long_long *in_stack_000000f0;
  basic_random_coro_file<(coro_io::execution_type)2> *in_stack_000000f8;
  size_t in_stack_00000120;
  pair<std::error_code,_unsigned_long> *value;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  LazyPromise<std::pair<std::error_code,_unsigned_long>_> *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int iVar3;
  
  puVar2 = (undefined8 *)operator_new(0xa8,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = async_pread;
    puVar2[1] = async_pread;
    puVar2[0x13] = in_RSI;
    puVar2[0xd] = in_RDX;
    puVar2[0xe] = in_RCX;
    puVar2[0xf] = in_R8;
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::LazyPromise
              ((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object(in_stack_fffffffffffffe68);
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xa5));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xa5));
      value = (pair<std::error_code,_unsigned_long> *)puVar2[0xf];
      async_prw<long(*)(int,void*,unsigned_long,long)>
                (in_stack_000000f8,in_stack_000000f0,in_stack_000000ef,in_stack_000000e0,
                 in_stack_000000d8,in_stack_00000120);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                 (Lazy<std::pair<std::error_code,_unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      bVar1 = async_simple::coro::detail::
              LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::await_ready
                        ((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                         (puVar2 + 0x10));
      if (bVar1) {
        puVar2[0xc] = (LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)(puVar2 + 0x10)
        ;
        async_simple::coro::detail::LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_>::
        awaitResume((LazyAwaiterBase<std::pair<std::error_code,_unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
        async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
        return_value<std::pair<std::error_code,_unsigned_long>_>
                  ((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),value);
        iVar3 = 0;
        async_simple::coro::detail::LazyBase<std::pair<std::error_code,_unsigned_long>,_false>::
        ValueAwaiter::~ValueAwaiter((ValueAwaiter *)0x19b689);
        async_simple::coro::Lazy<std::pair<std::error_code,_unsigned_long>_>::~Lazy
                  ((Lazy<std::pair<std::error_code,_unsigned_long>_> *)0x19b696);
        if (iVar3 == 0) {
          async_simple::coro::detail::LazyPromiseBase::final_suspend
                    ((LazyPromiseBase *)(puVar2 + 2));
          bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                            ((FinalAwaiter *)((long)puVar2 + 0xa6));
          if (!bVar1) {
            *puVar2 = 0;
            *(undefined1 *)((long)puVar2 + 0xa4) = 2;
            coro_io::basic_random_coro_file
                      ((void *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                       (void *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<std::pair<std::error_code,_unsigned_long>_>)
                   in_RDI._coro.__handle_.__handle_;
          }
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xa6));
        }
        async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
        ~LazyPromise((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)0x19b80b);
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0xa8);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0xa4) = 1;
        coro_io::basic_random_coro_file
                  ((void *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   in_stack_fffffffffffffe68);
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0xa4) = 0;
      coro_io::basic_random_coro_file
                ((void *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (void *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    }
  }
  return (Lazy<std::pair<std::error_code,_unsigned_long>_>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_pread(
      size_t offset, char *data, size_t size) {
#if defined(ASIO_WINDOWS)
    auto pread = [](int fd, void *buf, uint64_t count,
                    uint64_t offset) -> int64_t {
      DWORD bytes_read = 0;
      OVERLAPPED overlapped;
      memset(&overlapped, 0, sizeof(OVERLAPPED));
      overlapped.Offset = offset & 0xFFFFFFFF;
      overlapped.OffsetHigh = (offset >> 32) & 0xFFFFFFFF;

      BOOL ok = ReadFile(reinterpret_cast<HANDLE>(_get_osfhandle(fd)), buf,
                         count, &bytes_read, &overlapped);
      if (!ok && (errno = GetLastError()) != ERROR_HANDLE_EOF) {
        return -1;
      }

      return bytes_read;
    };
#endif
    co_return co_await async_prw(pread, true, offset, data, size);
  }